

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

bool nite::isMouseInRegion(Vec2 *P,Vec2 *Q)

{
  bool bVar1;
  
  if (((((float)(int)mouseCurrentPosition.x < P->x) || (Q->x < (float)(int)mouseCurrentPosition.x))
      || ((float)(int)mouseCurrentPosition.y < P->y)) ||
     (bVar1 = true, Q->y < (float)(int)mouseCurrentPosition.y)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool nite::isMouseInRegion(const nite::Vec2 &P, const nite::Vec2 &Q){
	return isMouseInRegion(P.x, P.y, Q.x, Q.y);
}